

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O2

void sptk::world::fast_fftfilt
               (double *x,int x_length,double *h,int h_length,int fft_size,
               ForwardRealFFT *forward_real_fft,InverseRealFFT *inverse_real_fft,double *y)

{
  double dVar1;
  double dVar2;
  fft_complex *padVar3;
  fft_complex *padVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  fft_plan *pfVar11;
  undefined8 *puVar12;
  byte bVar13;
  fft_plan in_stack_ffffffffffffff58;
  
  bVar13 = 0;
  uVar7 = 0xffffffffffffffff;
  if (-1 < fft_size) {
    uVar7 = (ulong)(uint)fft_size << 4;
  }
  pvVar6 = operator_new__(uVar7);
  uVar7 = 0;
  uVar9 = 0;
  if (0 < x_length) {
    uVar9 = (ulong)(uint)x_length;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    forward_real_fft->waveform[uVar7] = x[uVar7] / (double)fft_size;
  }
  for (lVar8 = (long)x_length; lVar8 < fft_size; lVar8 = lVar8 + 1) {
    forward_real_fft->waveform[lVar8] = 0.0;
  }
  pfVar11 = &forward_real_fft->forward_fft;
  puVar12 = (undefined8 *)&stack0xffffffffffffff58;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar12 = *(undefined8 *)pfVar11;
    pfVar11 = (fft_plan *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  fft_execute(in_stack_ffffffffffffff58);
  iVar5 = -1;
  if (-1 < fft_size / 2) {
    iVar5 = fft_size / 2;
  }
  lVar10 = (ulong)(iVar5 + 1) << 4;
  for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 0x10) {
    padVar3 = forward_real_fft->spectrum;
    *(undefined8 *)((long)pvVar6 + lVar8) = *(undefined8 *)((long)*padVar3 + lVar8);
    *(undefined8 *)((long)pvVar6 + lVar8 + 8) = *(undefined8 *)((long)*padVar3 + lVar8 + 8);
  }
  uVar7 = 0;
  uVar9 = 0;
  if (0 < h_length) {
    uVar9 = (ulong)(uint)h_length;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    forward_real_fft->waveform[uVar7] = h[uVar7] / (double)fft_size;
  }
  for (lVar8 = (long)h_length; lVar8 < fft_size; lVar8 = lVar8 + 1) {
    forward_real_fft->waveform[lVar8] = 0.0;
  }
  pfVar11 = &forward_real_fft->forward_fft;
  puVar12 = (undefined8 *)&stack0xffffffffffffff58;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar12 = *(undefined8 *)pfVar11;
    pfVar11 = (fft_plan *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  fft_execute(in_stack_ffffffffffffff58);
  for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 0x10) {
    padVar3 = forward_real_fft->spectrum;
    dVar1 = *(double *)((long)pvVar6 + lVar8);
    dVar2 = *(double *)((long)pvVar6 + lVar8 + 8);
    padVar4 = inverse_real_fft->spectrum;
    *(double *)((long)*padVar4 + lVar8) =
         *(double *)((long)*padVar3 + lVar8) * dVar1 -
         *(double *)((long)*padVar3 + lVar8 + 8) * dVar2;
    *(double *)((long)*padVar4 + lVar8 + 8) =
         dVar1 * *(double *)((long)*padVar3 + lVar8 + 8) +
         dVar2 * *(double *)((long)*padVar3 + lVar8);
  }
  pfVar11 = &inverse_real_fft->inverse_fft;
  puVar12 = (undefined8 *)&stack0xffffffffffffff58;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar12 = *(undefined8 *)pfVar11;
    pfVar11 = (fft_plan *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
    puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
  }
  fft_execute(in_stack_ffffffffffffff58);
  uVar9 = 0;
  uVar7 = (ulong)(uint)fft_size;
  if (fft_size < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    y[uVar9] = inverse_real_fft->waveform[uVar9];
  }
  operator_delete__(pvVar6);
  return;
}

Assistant:

void fast_fftfilt(const double *x, int x_length, const double *h, int h_length,
    int fft_size, const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft, double *y) {
  fft_complex *x_spectrum = new fft_complex[fft_size];

  for (int i = 0; i < x_length; ++i)
    forward_real_fft->waveform[i] = x[i] / fft_size;
  for (int i = x_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    x_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    x_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < h_length; ++i)
    forward_real_fft->waveform[i] = h[i] / fft_size;
  for (int i = h_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][0] -
      x_spectrum[i][1] * forward_real_fft->spectrum[i][1];
    inverse_real_fft->spectrum[i][1] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][1] +
      x_spectrum[i][1] * forward_real_fft->spectrum[i][0];
  }
  fft_execute(inverse_real_fft->inverse_fft);

  for (int i = 0; i < fft_size; ++i)
    y[i] = inverse_real_fft->waveform[i];

  delete[] x_spectrum;
}